

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.cc
# Opt level: O2

void __thiscall
pstack::InflateReader::InflateReader(InflateReader *this,size_t inflatedSize,Reader *upstream)

{
  int iVar1;
  uint uVar2;
  char *data_;
  Exception *pEVar3;
  bool bVar4;
  Reader *things;
  bool bVar5;
  long lVar6;
  undefined1 local_8258 [8];
  char xferbuf [32768];
  undefined1 auStack_b8 [8];
  z_stream stream;
  allocator<char> local_31;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(xferbuf + 0x7ff8),"inflated content from ",&local_31);
  stringify<pstack::Reader_const&>((string *)auStack_b8,(pstack *)upstream,things);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8258,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (xferbuf + 0x7ff8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_b8);
  data_ = (char *)operator_new__(inflatedSize);
  MemReader::MemReader(&this->super_MemReader,(string *)local_8258,inflatedSize,data_);
  std::__cxx11::string::~string((string *)local_8258);
  std::__cxx11::string::~string((string *)auStack_b8);
  std::__cxx11::string::~string((string *)(xferbuf + 0x7ff8));
  (this->super_MemReader).super_Reader._vptr_Reader = (_func_int **)&PTR__InflateReader_0019bb20;
  stream.data_type = 0;
  stream._92_4_ = 0;
  stream.adler = 0;
  stream.zfree = (free_func)0x0;
  stream.opaque = (voidpf)0x0;
  stream.state = (internal_state *)0x0;
  stream.zalloc = (alloc_func)0x0;
  stream.total_out = 0;
  stream.msg = (char *)0x0;
  stream.next_out = (Bytef *)0x0;
  stream.avail_out = 0;
  stream._36_4_ = 0;
  stream.avail_in = 0;
  stream._12_4_ = 0;
  stream.total_in = 0;
  auStack_b8 = (undefined1  [8])0x0;
  stream.next_in = (Bytef *)0x0;
  iVar1 = inflateInit2_(auStack_b8,0xf,"1.2.11");
  if (iVar1 != 0) {
    pEVar3 = (Exception *)__cxa_allocate_exception(0x1a0);
    memset((Exception *)(xferbuf + 0x7ff8),0,0x1a0);
    Exception::Exception((Exception *)(xferbuf + 0x7ff8));
    std::operator<<((ostream *)&stack0xfffffffffffffdb0,"inflateInit2 failed");
    Exception::Exception(pEVar3,(Exception *)(xferbuf + 0x7ff8));
    __cxa_throw(pEVar3,&Exception::typeinfo,Exception::~Exception);
  }
  stream.next_out = (Bytef *)CONCAT44(stream.next_out._4_4_,(int)inflatedSize);
  stream.total_in = (uLong)(this->super_MemReader).data;
  bVar5 = false;
  lVar6 = 0;
  bVar4 = false;
  while( true ) {
    do {
      if (bVar4) {
        inflateEnd(auStack_b8);
        return;
      }
      if (((int)stream.next_in == 0) && (!bVar5)) {
        uVar2 = (*upstream->_vptr_Reader[2])(upstream,lVar6,0x8000,(string *)local_8258);
        stream.next_in = (Bytef *)CONCAT44(stream.next_in._4_4_,uVar2);
        bVar4 = true;
        if (uVar2 != 0) {
          bVar4 = bVar5;
        }
        lVar6 = lVar6 + (ulong)uVar2;
        auStack_b8 = (undefined1  [8])local_8258;
        bVar5 = bVar4;
      }
      iVar1 = inflate((string *)auStack_b8);
      bVar4 = false;
    } while (iVar1 == 0);
    if (iVar1 != 1) break;
    bVar4 = true;
  }
  pEVar3 = (Exception *)__cxa_allocate_exception(0x1a0);
  memset((Exception *)(xferbuf + 0x7ff8),0,0x1a0);
  Exception::Exception((Exception *)(xferbuf + 0x7ff8));
  std::operator<<((ostream *)&stack0xfffffffffffffdb0,"inflate failed");
  Exception::Exception(pEVar3,(Exception *)(xferbuf + 0x7ff8));
  __cxa_throw(pEVar3,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

InflateReader::InflateReader(size_t inflatedSize, const Reader &upstream)
    : MemReader(std::string("inflated content from ") + stringify(upstream),
          inflatedSize, new char[inflatedSize])
{
    char xferbuf[32768];

    z_stream stream{};

    int window = 15;
    if (inflateInit2(&stream, window) != Z_OK)
        throw (Exception() << "inflateInit2 failed");

    stream.avail_out = inflatedSize;
    using bytep = Bytef *;
    stream.next_out = bytep(data);
    bool eof = false;
    size_t inputOffset = 0;
    for (bool done = false; !done; ) {
        if (stream.avail_in == 0 && !eof) {
            // keep the input buffer full
            stream.avail_in = upstream.read(inputOffset, sizeof xferbuf, xferbuf);
            inputOffset += stream.avail_in;
            stream.next_in = bytep(xferbuf);
            if (stream.avail_in == 0)
                eof = true;
        }
        switch (inflate(&stream, eof ? Z_FINISH : Z_SYNC_FLUSH)) {
            case Z_STREAM_END:
                done = true;
                // fallthrough
            case Z_OK:
                break;
            default:
                throw (Exception() << "inflate failed");
        }
    }
    inflateEnd(&stream);
}